

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::IsExecutableWithExports(cmTarget *this)

{
  TargetType TVar1;
  bool local_4e;
  allocator local_39;
  string local_38;
  cmTarget *local_18;
  cmTarget *this_local;
  
  local_18 = this;
  TVar1 = GetType(this);
  local_4e = false;
  if (TVar1 == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"ENABLE_EXPORTS",&local_39);
    local_4e = GetPropertyAsBool(this,&local_38);
  }
  this_local._7_1_ = local_4e;
  if (TVar1 == EXECUTABLE) {
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTarget::IsExecutableWithExports() const
{
  return (this->GetType() == cmStateEnums::EXECUTABLE &&
          this->GetPropertyAsBool("ENABLE_EXPORTS"));
}